

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O3

size_t cobs_decode(uint8_t *input,size_t length,uint8_t *output)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  
  if (length != 0) {
    sVar2 = 0;
    uVar3 = 0;
    while (bVar1 = input[uVar3], (ulong)bVar1 == 1 || uVar3 + bVar1 <= length) {
      uVar3 = uVar3 + 1;
      if (1 < bVar1) {
        cVar4 = bVar1 - 1;
        do {
          output[sVar2] = input[uVar3];
          sVar2 = sVar2 + 1;
          uVar3 = uVar3 + 1;
          cVar4 = cVar4 + -1;
        } while (cVar4 != '\0');
      }
      if (uVar3 != length && bVar1 != 0xff) {
        output[sVar2] = '\0';
        sVar2 = sVar2 + 1;
      }
      if (length <= uVar3) {
        return sVar2;
      }
    }
  }
  return 0;
}

Assistant:

size_t cobs_decode(const uint8_t *  input, size_t length, uint8_t *  output)
{
  size_t read_index = 0;
  size_t write_index = 0;
  uint8_t code;


  while(read_index < length)
  {
    code = input[read_index];

    if(read_index + code > length && code != 1)
    {
      return 0;
    }

    read_index++;

    for(uint8_t i = 1; i < code; i++)
    {
      output[write_index++] = input[read_index++];
    }

    if(code != 0xFF && read_index != length)
    {
      output[write_index++] = '\0';
    }
  }

  return write_index;
}